

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParseFromBoundedZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input,int size)

{
  bool bVar1;
  int iVar2;
  bool local_92;
  undefined1 local_70 [8];
  CodedInputStream decoder;
  int size_local;
  ZeroCopyInputStream *input_local;
  MessageLite *this_local;
  
  decoder.extension_factory_._4_4_ = size;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_70,input);
  io::CodedInputStream::PushLimit((CodedInputStream *)local_70,decoder.extension_factory_._4_4_);
  bVar1 = ParseFromCodedStream(this,(CodedInputStream *)local_70);
  local_92 = false;
  if (bVar1) {
    bVar1 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_70);
    local_92 = false;
    if (bVar1) {
      iVar2 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)local_70);
      local_92 = iVar2 == 0;
    }
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_70);
  return local_92;
}

Assistant:

bool MessageLite::ParseFromBoundedZeroCopyStream(
    io::ZeroCopyInputStream* input, int size) {
  io::CodedInputStream decoder(input);
  decoder.PushLimit(size);
  return ParseFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage() &&
         decoder.BytesUntilLimit() == 0;
}